

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

bool __thiscall
TTD::ExecutionInfoManager::TryGetTopCallCallerCounter
          (ExecutionInfoManager *this,SingleCallCounter *caller)

{
  int iVar1;
  SingleCallCounter *pSVar2;
  long lVar3;
  byte bVar4;
  
  bVar4 = 0;
  iVar1 = (this->m_callStack).
          super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>.count;
  if (1 < iVar1) {
    pSVar2 = JsUtil::ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>::
             Item(&(this->m_callStack).
                   super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>
                  ,iVar1 + -2);
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      caller->Function = pSVar2->Function;
      pSVar2 = (SingleCallCounter *)((long)pSVar2 + (ulong)bVar4 * -0x10 + 8);
      caller = (SingleCallCounter *)((long)caller + (ulong)bVar4 * -0x10 + 8);
    }
  }
  return 1 < iVar1;
}

Assistant:

bool ExecutionInfoManager::TryGetTopCallCallerCounter(SingleCallCounter& caller) const
    {
        if(this->m_callStack.Count() < 2)
        {
            return false;
        }
        else
        {
            caller = this->m_callStack.Item(this->m_callStack.Count() - 2);
            return true;
        }
    }